

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::
     IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
               (char *buf,idx_t len,IntegerCastData<short> *result,bool strict)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  idx_t iVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  
  if (*buf == '+' && strict) {
    return false;
  }
  uVar2 = (ulong)(*buf == '+');
  uVar7 = (uint)(ushort)result->result;
  uVar3 = uVar2;
  do {
    if (len <= uVar3) {
LAB_0152cff2:
      return uVar2 < uVar3;
    }
    bVar1 = buf[uVar3] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar3] == '.') {
        if (strict) {
          return false;
        }
        uVar4 = uVar3 + 1;
        iVar5 = 3;
        if (uVar4 < len) {
          iVar5 = 0;
          iVar8 = 1;
          if (9 < (byte)(buf[uVar4] - 0x30U)) goto LAB_0152cf98;
        }
        else {
LAB_0152cf98:
          iVar8 = 1;
          if (uVar2 < uVar3) {
            iVar8 = iVar5;
          }
        }
        uVar3 = uVar4;
        if (iVar8 == 3) goto LAB_0152cff2;
        if (iVar8 != 0) {
          return false;
        }
      }
      if ((4 < (byte)buf[uVar3] - 9) && (buf[uVar3] != 0x20)) {
        return false;
      }
      uVar4 = uVar3 + 1;
      uVar3 = uVar4;
      if (uVar4 < len) {
        do {
          if ((4 < (byte)buf[uVar4] - 9) && (buf[uVar4] != 0x20)) {
            return false;
          }
          uVar4 = uVar4 + 1;
          uVar3 = len;
        } while (len != uVar4);
      }
      goto LAB_0152cff2;
    }
    iVar6 = uVar3 + 1;
    if ((int)((bVar1 ^ 0x7ffe) / 10) < (int)(short)uVar7) {
      bVar9 = false;
    }
    else {
      uVar7 = (uint)bVar1 + (short)uVar7 * 10;
      result->result = (ResultType_conflict)uVar7;
      bVar9 = true;
      if ((iVar6 != len) && (buf[iVar6] == '_' && !strict)) {
        iVar6 = uVar3 + 2;
        if (iVar6 == len) {
          bVar9 = false;
        }
        else {
          bVar9 = (byte)(buf[iVar6] - 0x30U) < 10;
        }
      }
    }
    uVar3 = iVar6;
    if (!bVar9) {
      return false;
    }
  } while( true );
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}